

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> * __thiscall
cmDebugger_impl::GetWatchpoints
          (vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *__return_storage_ptr__,
          cmDebugger_impl *this)

{
  _Base_ptr p_Var1;
  shared_ptr<cmDebugger_impl::Watchpoint> watch;
  __shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock(&this->breakpointMutex);
  (__return_storage_ptr__->super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::reserve
            (__return_storage_ptr__,
             (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var1 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&p_Var1[1]._M_parent);
    if (local_40._M_ptr != (element_type *)0x0) {
      std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::push_back
                (__return_storage_ptr__,&(local_40._M_ptr)->super_cmWatchpoint);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmWatchpoint> GetWatchpoints() const override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    std::vector<cmWatchpoint> rtn;
    rtn.reserve(activeWatchpoints.size());
    for (auto& watchWeak : activeWatchpoints) {
      if (auto watch = watchWeak.second.lock()) {
        rtn.push_back(*watch);
      }
    }
    return rtn;
  }